

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir_nav_kernel_2.cpp
# Opt level: O1

directory * __thiscall
dlib::directory::get_parent(directory *__return_storage_ptr__,directory *this)

{
  string *this_00;
  size_type sVar1;
  pointer pcVar2;
  long lVar3;
  string *psVar4;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  sVar1 = (this->state).name._M_string_length;
  this_00 = &(__return_storage_ptr__->state).full_name;
  (__return_storage_ptr__->state).name._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->state).name.field_2;
  if (sVar1 == 0) {
    pcVar2 = (this->state).name._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,pcVar2,pcVar2);
    (__return_storage_ptr__->state).full_name._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->state).full_name.field_2;
    pcVar2 = (this->state).full_name._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)this_00,pcVar2,pcVar2 + (this->state).full_name._M_string_length);
  }
  else {
    (__return_storage_ptr__->state).name._M_string_length = 0;
    (__return_storage_ptr__->state).name.field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->state).full_name._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->state).full_name.field_2;
    (__return_storage_ptr__->state).full_name._M_string_length = 0;
    (__return_storage_ptr__->state).full_name.field_2._M_local_buf[0] = '\0';
    psVar4 = &(this->state).full_name;
    std::__cxx11::string::rfind((char)psVar4,0x2f);
    std::__cxx11::string::substr((ulong)local_40,(ulong)psVar4);
    std::__cxx11::string::operator=((string *)this_00,(string *)local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0]);
    }
    if ((((__return_storage_ptr__->state).full_name._M_string_length != 1) ||
        (*(this_00->_M_dataplus)._M_p != '/')) &&
       (lVar3 = std::__cxx11::string::rfind((char)this_00,0x2f), lVar3 != -1)) {
      std::__cxx11::string::substr((ulong)local_40,(ulong)this_00);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_40);
      if (local_40[0] == local_30) {
        return __return_storage_ptr__;
      }
      operator_delete(local_40[0]);
      return __return_storage_ptr__;
    }
    std::__cxx11::string::push_back((char)this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

const directory directory::
    get_parent (
    ) const
    {
        using namespace std;
        // if *this is the root then just return *this
        if (is_root())
        {
            return *this;
        }
        else
        {
            directory temp;

            const char sep = get_separator();

            string::size_type pos = state.full_name.find_last_of(sep);
            temp.state.full_name = state.full_name.substr(0,pos);

            if ( is_root_path(temp.state.full_name))
            {
                temp.state.full_name += sep;
            }
            else
            {
                pos = temp.state.full_name.find_last_of(sep);
                if (pos != string::npos)
                {
                    temp.state.name = temp.state.full_name.substr(pos+1);
                }
                else
                {
                    temp.state.full_name += sep;
                }
            }
            return temp;
        }
    }